

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# suffix-test.cc
# Opt level: O2

void __thiscall SuffixTest_VisitSuffixValues_Test::TestBody(SuffixTest_VisitSuffixValues_Test *this)

{
  char **ppcVar1;
  MockSpec<void_(int,_int)> *pMVar2;
  MockSpec<void_(int,_double)> *pMVar3;
  SuffixSet *this_00;
  StringRef name;
  StringRef name_00;
  BasicMutSuffix<int> is;
  MatcherBase<int> local_138;
  BasicSuffix<int> local_120;
  MockValueVisitor v;
  
  this_00 = &(this->super_SuffixTest).suffixes_;
  ppcVar1 = &v.gmock2_Visit_146.super_FunctionMockerBase<void_(int,_int)>.
             super_UntypedFunctionMockerBase.name_;
  v.gmock2_Visit_146.super_FunctionMockerBase<void_(int,_int)>.super_UntypedFunctionMockerBase.
  mock_obj_ = (void *)0x0;
  v.gmock2_Visit_146.super_FunctionMockerBase<void_(int,_int)>.super_UntypedFunctionMockerBase.name_
  ._0_1_ = 0;
  name.size_ = 2;
  name.data_ = "is";
  v.gmock2_Visit_146.super_FunctionMockerBase<void_(int,_int)>.super_UntypedFunctionMockerBase.
  _vptr_UntypedFunctionMockerBase = (_func_int **)ppcVar1;
  is = mp::BasicSuffixSet<std::allocator<char>_>::Add<int>(this_00,name,0,3,(SuffixTable *)&v);
  std::__cxx11::string::~string((string *)&v);
  mp::BasicMutSuffix<int>::set_value(&is,0,0x2a);
  mp::BasicMutSuffix<int>::set_value(&is,1,0);
  mp::BasicMutSuffix<int>::set_value(&is,2,0xb);
  local_120.super_SuffixBase.impl_ =
       (SuffixBase)(SuffixBase)is.super_BasicSuffix<int>.super_SuffixBase.impl_;
  MockValueVisitor::MockValueVisitor(&v);
  testing::Matcher<int>::Matcher((Matcher<int> *)&is,0);
  testing::Matcher<int>::Matcher((Matcher<int> *)&local_138,0x2a);
  pMVar2 = MockValueVisitor::gmock_Visit(&v,(Matcher<int> *)&is,(Matcher<int> *)&local_138);
  testing::internal::MockSpec<void_(int,_int)>::InternalExpectedAt
            (pMVar2,
             "/workspace/llm4binary/github/license_c_cmakelists/ampl[P]mp/test/suffix-test.cc",0xb7,
             "v","Visit(0, Matcher<int>(42))");
  testing::internal::MatcherBase<int>::~MatcherBase(&local_138);
  testing::internal::MatcherBase<int>::~MatcherBase((MatcherBase<int> *)&is);
  testing::Matcher<int>::Matcher((Matcher<int> *)&is,2);
  testing::Matcher<int>::Matcher((Matcher<int> *)&local_138,0xb);
  pMVar2 = MockValueVisitor::gmock_Visit(&v,(Matcher<int> *)&is,(Matcher<int> *)&local_138);
  testing::internal::MockSpec<void_(int,_int)>::InternalExpectedAt
            (pMVar2,
             "/workspace/llm4binary/github/license_c_cmakelists/ampl[P]mp/test/suffix-test.cc",0xb8,
             "v","Visit(2, Matcher<int>(11))");
  testing::internal::MatcherBase<int>::~MatcherBase(&local_138);
  testing::internal::MatcherBase<int>::~MatcherBase((MatcherBase<int> *)&is);
  mp::Suffix::VisitValues<MockValueVisitor>((Suffix *)&local_120,&v);
  MockValueVisitor::~MockValueVisitor(&v);
  v.gmock2_Visit_146.super_FunctionMockerBase<void_(int,_int)>.super_UntypedFunctionMockerBase.
  mock_obj_ = (void *)0x0;
  v.gmock2_Visit_146.super_FunctionMockerBase<void_(int,_int)>.super_UntypedFunctionMockerBase.name_
  ._0_1_ = 0;
  name_00.size_ = 2;
  name_00.data_ = "ds";
  v.gmock2_Visit_146.super_FunctionMockerBase<void_(int,_int)>.super_UntypedFunctionMockerBase.
  _vptr_UntypedFunctionMockerBase = (_func_int **)ppcVar1;
  is.super_BasicSuffix<int>.super_SuffixBase.impl_ =
       (BasicSuffix<int>)
       mp::BasicSuffixSet<std::allocator<char>_>::Add<double>(this_00,name_00,0,3,(SuffixTable *)&v)
  ;
  std::__cxx11::string::~string((string *)&v);
  mp::BasicMutSuffix<double>::set_value((BasicMutSuffix<double> *)&is,0,4.2);
  mp::BasicMutSuffix<double>::set_value((BasicMutSuffix<double> *)&is,1,0.0);
  mp::BasicMutSuffix<double>::set_value((BasicMutSuffix<double> *)&is,2,1.1);
  local_120.super_SuffixBase.impl_ =
       (SuffixBase)(SuffixBase)is.super_BasicSuffix<int>.super_SuffixBase.impl_;
  MockValueVisitor::MockValueVisitor(&v);
  testing::Matcher<int>::Matcher((Matcher<int> *)&is,0);
  testing::Matcher<double>::Matcher((Matcher<double> *)&local_138,4.2);
  pMVar3 = MockValueVisitor::gmock_Visit(&v,(Matcher<int> *)&is,(Matcher<double> *)&local_138);
  testing::internal::MockSpec<void_(int,_double)>::InternalExpectedAt
            (pMVar3,
             "/workspace/llm4binary/github/license_c_cmakelists/ampl[P]mp/test/suffix-test.cc",0xc4,
             "v","Visit(0, Matcher<double>(4.2))");
  testing::internal::MatcherBase<double>::~MatcherBase((MatcherBase<double> *)&local_138);
  testing::internal::MatcherBase<int>::~MatcherBase((MatcherBase<int> *)&is);
  testing::Matcher<int>::Matcher((Matcher<int> *)&is,2);
  testing::Matcher<double>::Matcher((Matcher<double> *)&local_138,1.1);
  pMVar3 = MockValueVisitor::gmock_Visit(&v,(Matcher<int> *)&is,(Matcher<double> *)&local_138);
  testing::internal::MockSpec<void_(int,_double)>::InternalExpectedAt
            (pMVar3,
             "/workspace/llm4binary/github/license_c_cmakelists/ampl[P]mp/test/suffix-test.cc",0xc5,
             "v","Visit(2, Matcher<double>(1.1))");
  testing::internal::MatcherBase<double>::~MatcherBase((MatcherBase<double> *)&local_138);
  testing::internal::MatcherBase<int>::~MatcherBase((MatcherBase<int> *)&is);
  mp::Suffix::VisitValues<MockValueVisitor>((Suffix *)&local_120,&v);
  MockValueVisitor::~MockValueVisitor(&v);
  return;
}

Assistant:

TEST_F(SuffixTest, VisitSuffixValues) {
  Suffix s;
  {
    auto is = suffixes_.Add<int>("is", 0, 3);
    is.set_value(0, 42);
    is.set_value(1, 0);
    is.set_value(2, 11);
    s = is;
  }
  {
    MockValueVisitor v;
    EXPECT_CALL(v, Visit(0, Matcher<int>(42)));
    EXPECT_CALL(v, Visit(2, Matcher<int>(11)));
    s.VisitValues(v);
  }
  {
    auto ds = suffixes_.Add<double>("ds", 0, 3);
    ds.set_value(0, 4.2);
    ds.set_value(1, 0);
    ds.set_value(2, 1.1);
    s = ds;
  }
  {
    MockValueVisitor v;
    EXPECT_CALL(v, Visit(0, Matcher<double>(4.2)));
    EXPECT_CALL(v, Visit(2, Matcher<double>(1.1)));
    s.VisitValues(v);
  }
}